

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O3

void __thiscall
CMethod::CMethod(CMethod *this,CType *_returnType,IExpression *_returnExp,CIdExp *_name,
                CArgumentList *_arguments,CFieldList *_vars,CCompoundStm *_statements,bool _isPublic
                )

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  (this->super_IWrapper).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_0017ff48;
  (this->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
  super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.super__Head_base<0UL,_CType_*,_false>
  ._M_head_impl = _returnType;
  (this->returnExp)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = _returnExp;
  (this->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = _name;
  (this->arguments)._M_t.super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>.
  _M_t.super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
  super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl = _arguments;
  (this->statements)._M_t.super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>.
  _M_t.super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
  super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl = _statements;
  (this->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
  super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
  super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl = _vars;
  this->isPublic = _isPublic;
  iVar1 = (_name->super_IExpression).super_PositionedNode.position.lastLine;
  iVar2 = (_name->super_IExpression).super_PositionedNode.position.firstColumn;
  iVar3 = (_name->super_IExpression).super_PositionedNode.position.lastColumn;
  (this->super_IWrapper).super_PositionedNode.position.firstLine =
       (_name->super_IExpression).super_PositionedNode.position.firstLine;
  (this->super_IWrapper).super_PositionedNode.position.lastLine = iVar1;
  (this->super_IWrapper).super_PositionedNode.position.firstColumn = iVar2;
  (this->super_IWrapper).super_PositionedNode.position.lastColumn = iVar3;
  return;
}

Assistant:

CMethod::CMethod(CType* _returnType, IExpression* _returnExp, CIdExp* _name, CArgumentList* _arguments, CFieldList* _vars, CCompoundStm* _statements, bool _isPublic)
{
	returnType = std::unique_ptr<CType>(_returnType);
	returnExp = std::unique_ptr<IExpression>(_returnExp);
	name = std::unique_ptr<CIdExp>(_name);
	arguments = std::unique_ptr<CArgumentList>(_arguments);
	statements = std::unique_ptr<CCompoundStm>(_statements);
	vars = std::unique_ptr<CFieldList>(_vars);
	isPublic = _isPublic;
    position = _name->position;
}